

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LR.cpp
# Opt level: O1

void __thiscall lr_grammar::GrammarLR::GrammarLR(GrammarLR *this,string *generate,int length)

{
  _Rb_tree_header *p_Var1;
  vector<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_> *pvVar2;
  int iVar3;
  long lVar4;
  pointer pcVar5;
  pointer pvVar6;
  vector<int,_std::allocator<int>_> *this_00;
  iterator __position;
  int iVar7;
  pointer pbVar8;
  ulong uVar9;
  long *plVar10;
  ostream *poVar11;
  pointer piVar12;
  pointer pPVar13;
  int *piVar14;
  pointer pDVar15;
  pointer pEVar16;
  pointer pvVar17;
  long *plVar18;
  long lVar19;
  char *pcVar20;
  Express *this_01;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string text;
  string name;
  string finnalyC;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  result_of_name;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  vectorGenrates;
  vector<int,_std::allocator<int>_> exp;
  char buffer [8];
  undefined1 *local_2c0;
  undefined8 local_2b8;
  undefined1 local_2b0 [16];
  long *local_2a0;
  long local_298;
  long local_290;
  long lStack_288;
  vector<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_> *local_280;
  undefined1 local_278 [40];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_250;
  char *local_248;
  long local_240;
  char local_238 [16];
  ulong local_228;
  vector<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>,_std::allocator<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>_>_>
  *local_220;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_218;
  ulong local_210;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_208;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_1e8;
  vector<int,_std::allocator<int>_> local_1c8;
  ulong local_1b0;
  string local_1a8;
  char local_188 [8];
  string local_180;
  Express local_160;
  undefined1 *local_148 [2];
  undefined1 local_138 [16];
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  Express local_48;
  
  p_Var1 = &(this->name_of_keys)._M_t._M_impl.super__Rb_tree_header;
  (this->name_of_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->name_of_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->name_of_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->name_of_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  pvVar2 = &this->elements;
  local_218 = &this->first;
  local_250 = &this->follow;
  local_280 = &this->states;
  local_220 = &this->action_table;
  memset(&(this->name_of_keys)._M_t._M_impl.super__Rb_tree_header._M_node_count,0,200);
  local_1e8.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e8.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_228 = (ulong)(uint)length;
  if (0 < length) {
    lVar22 = local_228 << 5;
    lVar19 = 0;
    do {
      local_278._0_8_ = (pointer)0x0;
      local_278._8_8_ = (pointer)0x0;
      local_278._16_8_ = (pointer)0x0;
      lVar4 = *(long *)((long)&(generate->_M_dataplus)._M_p + lVar19);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_68,lVar4,
                 *(long *)((long)&generate->_M_string_length + lVar19) + lVar4);
      public_tool::parse_productions
                (&local_68,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_278);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
      std::
      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::push_back(&local_1e8,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_278);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_278);
      lVar19 = lVar19 + 0x20;
    } while (lVar22 != lVar19);
  }
  if (0 < length) {
    lVar19 = local_228 * 0x18;
    lVar22 = 0;
    do {
      plVar10 = *(long **)((long)&((local_1e8.
                                    super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + lVar22);
      lVar4 = *plVar10;
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_88,lVar4,plVar10[1] + lVar4);
      add_elem(this,&local_88,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p);
      }
      lVar22 = lVar22 + 0x18;
    } while (lVar19 != lVar22);
  }
  local_208.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (0 < length) {
    uVar9 = 0;
    do {
      pbVar8 = local_1e8.
               super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar9].
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_1b0 = uVar9;
      if (0x20 < (ulong)((long)local_1e8.
                               super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar9].
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8)) {
        uVar21 = 1;
        do {
          pcVar5 = pbVar8[uVar21]._M_dataplus._M_p;
          local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_180,pcVar5,pcVar5 + pbVar8[uVar21]._M_string_length);
          public_tool::parse_elem(&local_180,&local_208);
          local_210 = uVar21;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180._M_dataplus._M_p != &local_180.field_2) {
            operator_delete(local_180._M_dataplus._M_p);
          }
          local_278._0_8_ = (pointer)0x0;
          local_278._8_8_ = (pointer)0x0;
          local_278._16_8_ = (pointer)0x0;
          if (local_208.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_208.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            lVar19 = 8;
            uVar21 = 0;
            do {
              lVar22 = *(long *)((long)local_208.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + lVar19 + -8);
              local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_a8,lVar22,
                         *(long *)((long)&((local_208.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)
                                          ._M_p + lVar19) + lVar22);
              iVar7 = find_name(this,&local_a8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                operator_delete(local_a8._M_dataplus._M_p);
              }
              local_248 = (char *)CONCAT44(local_248._4_4_,iVar7);
              if (iVar7 == -2) {
                local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
                lVar22 = *(long *)((long)local_208.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + lVar19 + -8);
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_1a8,lVar22,
                           *(long *)((long)&((local_208.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            _M_dataplus)._M_p + lVar19) + lVar22);
                iVar7 = add_elem(this,&local_1a8,true);
                local_248 = (char *)CONCAT44(local_248._4_4_,iVar7);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                  operator_delete(local_1a8._M_dataplus._M_p);
                }
              }
              if (local_278._8_8_ == local_278._16_8_) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)local_278,(iterator)local_278._8_8_,
                           (int *)&local_248);
              }
              else {
                *(int *)local_278._8_8_ = (int)local_248;
                local_278._8_8_ = local_278._8_8_ + 4;
              }
              uVar21 = uVar21 + 1;
              lVar19 = lVar19 + 0x20;
            } while (uVar21 < (ulong)((long)local_208.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_208.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 5));
          }
          pbVar8 = local_1e8.
                   super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar9].
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pcVar5 = (pbVar8->_M_dataplus)._M_p;
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_c8,pcVar5,pcVar5 + pbVar8->_M_string_length);
          iVar7 = find_name(this,&local_c8);
          pEVar16 = (pvVar2->
                    super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          base_grammar::Express::Express(&local_48,(vector<int,_std::allocator<int>_> *)local_278);
          std::vector<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>::push_back
                    (&pEVar16[iVar7].expression_of_set,(value_type *)&local_48);
          if (local_48.expression.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_48.expression.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p);
          }
          uVar21 = local_210;
          if ((pointer)local_278._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_278._0_8_);
          }
          uVar21 = uVar21 + 1;
          pbVar8 = local_1e8.
                   super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar9].
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        } while (uVar21 < (ulong)((long)local_1e8.
                                        super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[uVar9].
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >>
                                 5));
      }
      uVar9 = local_1b0 + 1;
    } while (uVar9 != local_228);
  }
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"#","");
  add_elem(this,&local_e8,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  pEVar16 = (pvVar2->
            super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>).
            _M_impl.super__Vector_impl_data._M_start;
  local_278._0_8_ = local_278 + 0x10;
  pcVar5 = (pEVar16->super_Elem).name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_278,pcVar5,pcVar5 + (pEVar16->super_Elem).name._M_string_length);
  std::__cxx11::string::append(local_278);
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_108,local_278._0_8_,
             (undefined1 *)
             ((long)&((_Alloc_hider *)local_278._8_8_)->_M_p +
             (long)&((_Alloc_hider *)local_278._0_8_)->_M_p));
  iVar7 = add_elem(this,&local_108,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  local_1c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_1c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_1c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_248 = (char *)((ulong)local_248 & 0xffffffff00000000);
  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
            (&local_1c8,(iterator)0x0,(int *)&local_248);
  pEVar16 = (pvVar2->
            super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>).
            _M_impl.super__Vector_impl_data._M_start;
  base_grammar::Express::Express(&local_160,&local_1c8);
  std::vector<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>::push_back
            (&pEVar16[iVar7].expression_of_set,(value_type *)&local_160);
  if (local_160.expression.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_160.expression.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_248 = local_238;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"finnaly:","");
  pEVar16 = (this->elements).
            super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->elements).
      super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>._M_impl.
      super__Vector_impl_data._M_finish != pEVar16) {
    uVar9 = 0;
    do {
      if (pEVar16[uVar9].super_Elem.is_finally == false) {
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,pEVar16[uVar9].super_Elem.name._M_dataplus._M_p,
                             pEVar16[uVar9].super_Elem.name._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"->",2);
        pEVar16 = (pvVar2->
                  super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>)
                  ._M_impl.super__Vector_impl_data._M_start;
        if (*(pointer *)
             ((long)&pEVar16[uVar9].expression_of_set.
                     super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                     ._M_impl + 8) !=
            pEVar16[uVar9].expression_of_set.
            super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          uVar21 = 0;
          do {
            pEVar16 = (pvVar2->
                      super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            lVar19 = *(long *)&pEVar16[uVar9].expression_of_set.
                               super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                               ._M_impl.super__Vector_impl_data;
            lVar22 = *(long *)(lVar19 + uVar21 * 0x18);
            if (*(long *)(lVar19 + 8 + uVar21 * 0x18) != lVar22) {
              uVar23 = 0;
              do {
                lVar19 = (long)*(int *)(lVar22 + uVar23 * 4);
                if (lVar19 == -1) {
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"@",1);
                }
                else {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,pEVar16[lVar19].super_Elem.name._M_dataplus._M_p,
                             pEVar16[lVar19].super_Elem.name._M_string_length);
                }
                uVar23 = uVar23 + 1;
                pEVar16 = (pvVar2->
                          super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                lVar19 = *(long *)&pEVar16[uVar9].expression_of_set.
                                   super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                                   ._M_impl.super__Vector_impl_data;
                lVar22 = *(long *)(lVar19 + uVar21 * 0x18);
              } while (uVar23 < (ulong)(*(long *)(lVar19 + 8 + uVar21 * 0x18) - lVar22 >> 2));
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," | ",3);
            pEVar16 = (pvVar2->
                      super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            uVar21 = uVar21 + 1;
            uVar23 = ((long)*(pointer *)
                             ((long)&pEVar16[uVar9].expression_of_set.
                                     super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                                     ._M_impl + 8) -
                      *(long *)&pEVar16[uVar9].expression_of_set.
                                super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                                ._M_impl.super__Vector_impl_data >> 3) * -0x5555555555555555;
          } while (uVar21 <= uVar23 && uVar23 - uVar21 != 0);
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
        std::ostream::put('(');
        std::ostream::flush();
      }
      else {
        local_2c0 = local_2b0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2c0,local_248,local_248 + local_240);
        std::__cxx11::string::append((char *)&local_2c0);
        plVar10 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_2c0,
                                     (ulong)(pvVar2->
                                            super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                                            )._M_impl.super__Vector_impl_data._M_start[uVar9].
                                            super_Elem.name._M_dataplus._M_p);
        plVar18 = plVar10 + 2;
        if ((long *)*plVar10 == plVar18) {
          local_290 = *plVar18;
          lStack_288 = plVar10[3];
          local_2a0 = &local_290;
        }
        else {
          local_290 = *plVar18;
          local_2a0 = (long *)*plVar10;
        }
        local_298 = plVar10[1];
        *plVar10 = (long)plVar18;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_248,(string *)&local_2a0);
        if (local_2a0 != &local_290) {
          operator_delete(local_2a0);
        }
        if (local_2c0 != local_2b0) {
          operator_delete(local_2c0);
        }
      }
      uVar9 = uVar9 + 1;
      pEVar16 = (this->elements).
                super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar21 = ((long)(this->elements).
                      super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar16 >> 3) *
               -0x71c71c71c71c71c7;
    } while (uVar9 <= uVar21 && uVar21 - uVar9 != 0);
  }
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,local_248,local_240);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
  std::ostream::put((char)poVar11);
  std::ostream::flush();
  get_tow_char_index(this);
  create_first_set(this);
  if ((this->elements).
      super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->elements).
      super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar9 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"first[",6);
      pEVar16 = (pvVar2->
                super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>).
                _M_impl.super__Vector_impl_data._M_start;
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,pEVar16[uVar9].super_Elem.name._M_dataplus._M_p,
                           pEVar16[uVar9].super_Elem.name._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"]={",3);
      pvVar6 = (local_218->
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      piVar12 = pvVar6[uVar9].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&pvVar6[uVar9].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data + 8) != piVar12) {
        uVar21 = 0;
        do {
          lVar19 = (long)piVar12[uVar21];
          if (lVar19 == -1) {
            lVar19 = 2;
            poVar11 = (ostream *)&std::cout;
            pcVar20 = "@ ";
          }
          else {
            pEVar16 = (pvVar2->
                      super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,
                                 pEVar16[lVar19].super_Elem.name._M_dataplus._M_p,
                                 pEVar16[lVar19].super_Elem.name._M_string_length);
            lVar19 = 1;
            pcVar20 = " ";
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar20,lVar19);
          uVar21 = uVar21 + 1;
          pvVar6 = (local_218->
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          piVar12 = pvVar6[uVar9].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
        } while (uVar21 < (ulong)((long)*(pointer *)
                                         ((long)&pvVar6[uVar9].
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data + 8) -
                                  (long)piVar12 >> 2));
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"}\n",2);
      uVar9 = uVar9 + 1;
      uVar21 = ((long)(this->elements).
                      super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->elements).
                      super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7;
    } while (uVar9 <= uVar21 && uVar21 - uVar9 != 0);
  }
  this_00 = (local_250->
            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"#","");
  iVar7 = find_name(this,&local_128);
  local_2a0 = (long *)CONCAT44(local_2a0._4_4_,iVar7);
  __position._M_current =
       (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (__position._M_current ==
      (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (this_00,__position,(int *)&local_2a0);
  }
  else {
    *__position._M_current = iVar7;
    (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = __position._M_current + 1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p);
  }
  create_follow_set(this);
  pEVar16 = (this->elements).
            super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->elements).
      super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>._M_impl.
      super__Vector_impl_data._M_finish != pEVar16) {
    uVar9 = 0;
    do {
      if (pEVar16[uVar9].super_Elem.is_finally == false) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"follow[",7);
        pEVar16 = (pvVar2->
                  super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>)
                  ._M_impl.super__Vector_impl_data._M_start;
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,pEVar16[uVar9].super_Elem.name._M_dataplus._M_p,
                             pEVar16[uVar9].super_Elem.name._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"]={",3);
        pvVar6 = (local_250->
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        piVar12 = *(pointer *)&pvVar6[uVar9].super__Vector_base<int,_std::allocator<int>_>;
        if (*(pointer *)((long)(pvVar6 + uVar9) + 8) != piVar12) {
          uVar21 = 0;
          do {
            lVar19 = (long)piVar12[uVar21];
            if (lVar19 == -1) {
              lVar19 = 2;
              poVar11 = (ostream *)&std::cout;
              pcVar20 = "@ ";
            }
            else {
              pEVar16 = (pvVar2->
                        super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,
                                   pEVar16[lVar19].super_Elem.name._M_dataplus._M_p,
                                   pEVar16[lVar19].super_Elem.name._M_string_length);
              lVar19 = 1;
              pcVar20 = " ";
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar20,lVar19);
            uVar21 = uVar21 + 1;
            pvVar6 = (local_250->
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            piVar12 = *(pointer *)&pvVar6[uVar9].super__Vector_base<int,_std::allocator<int>_>;
          } while (uVar21 < (ulong)((long)*(pointer *)((long)(pvVar6 + uVar9) + 8) - (long)piVar12
                                   >> 2));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"}\n",2);
      }
      uVar9 = uVar9 + 1;
      pEVar16 = (this->elements).
                super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar21 = ((long)(this->elements).
                      super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar16 >> 3) *
               -0x71c71c71c71c71c7;
    } while (uVar9 <= uVar21 && uVar21 - uVar9 != 0);
  }
  create_dfa_states(this);
  if ((this->states).super__Vector_base<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->states).super__Vector_base<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar9 = 0;
    do {
      pDVar15 = (local_280->
                super__Vector_base<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_>).
                _M_impl.super__Vector_impl_data._M_start;
      pPVar13 = *(pointer *)
                 &pDVar15[uVar9].projects.
                  super__Vector_base<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>.
                  _M_impl;
      local_210 = uVar9;
      if (*(pointer *)
           ((long)&pDVar15[uVar9].projects.
                   super__Vector_base<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>.
                   _M_impl + 8) != pPVar13) {
        uVar21 = 0;
        do {
          iVar7 = pPVar13[uVar21].elemKey;
          lVar22 = (long)pPVar13[uVar21].expressIndex;
          iVar3 = pPVar13[uVar21].projectPoint;
          pEVar16 = (pvVar2->
                    super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,pEVar16[iVar7].super_Elem.name._M_dataplus._M_p
                               ,pEVar16[iVar7].super_Elem.name._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"->",2);
          lVar19 = *(long *)&(pvVar2->
                             super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                             )._M_impl.super__Vector_impl_data._M_start[iVar7].expression_of_set.
                             super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                             ._M_impl.super__Vector_impl_data;
          if (*(long *)(lVar19 + 8 + lVar22 * 0x18) != *(long *)(lVar19 + lVar22 * 0x18)) {
            this_01 = (Express *)(lVar19 + lVar22 * 0x18);
            uVar23 = 0;
            do {
              piVar14 = base_grammar::Express::operator[](this_01,(int)uVar23);
              if (*piVar14 == -1) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"@",1);
              }
              else {
                piVar14 = base_grammar::Express::operator[]
                                    ((Express *)
                                     (lVar22 * 0x18 +
                                     *(long *)&(pvVar2->
                                               super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                                               )._M_impl.super__Vector_impl_data._M_start[iVar7].
                                               expression_of_set.
                                               super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                                               ._M_impl.super__Vector_impl_data),(int)uVar23);
                pEVar16 = (pvVar2->
                          super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,pEVar16[*piVar14].super_Elem.name._M_dataplus._M_p,
                           pEVar16[*piVar14].super_Elem.name._M_string_length);
              }
              uVar23 = uVar23 + 1;
              this_01 = (Express *)
                        (*(long *)&(pvVar2->
                                   super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                                   )._M_impl.super__Vector_impl_data._M_start[iVar7].
                                   expression_of_set.
                                   super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                                   ._M_impl.super__Vector_impl_data + lVar22 * 0x18);
            } while (uVar23 < (ulong)((long)(this_01->expression).
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_finish -
                                      (long)(this_01->expression).
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_start >> 2));
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"  ProjectPoint:",0xf);
          plVar10 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
          std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
          std::ostream::put((char)plVar10);
          std::ostream::flush();
          uVar21 = uVar21 + 1;
          pDVar15 = (local_280->
                    super__Vector_base<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_>)
                    ._M_impl.super__Vector_impl_data._M_start;
          pPVar13 = *(pointer *)
                     &pDVar15[uVar9].projects.
                      super__Vector_base<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>.
                      _M_impl;
          uVar23 = ((long)*(pointer *)
                           ((long)&pDVar15[uVar9].projects.
                                   super__Vector_base<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>
                                   ._M_impl + 8) - (long)pPVar13 >> 2) * -0x5555555555555555;
        } while (uVar21 <= uVar23 && uVar23 - uVar21 != 0);
      }
      pDVar15 = (local_280->
                super__Vector_base<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_>).
                _M_impl.super__Vector_impl_data._M_start;
      if (0 < pDVar15[uVar9].elementCount) {
        lVar19 = 4;
        lVar22 = 0;
        do {
          if (pDVar15[uVar9].next[lVar22] != -1) {
            pEVar16 = (pvVar2->
                      super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,*(char **)((long)pEVar16 + lVar19 * 4 + -8),
                                 *(long *)(&(pEVar16->super_Elem).key + lVar19));
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"--",2);
            poVar11 = (ostream *)
                      std::ostream::operator<<
                                (poVar11,(local_280->
                                         super__Vector_base<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_>
                                         )._M_impl.super__Vector_impl_data._M_start[uVar9].next
                                         [lVar22]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"  ",2);
          }
          lVar22 = lVar22 + 1;
          pDVar15 = (local_280->
                    super__Vector_base<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_>)
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar19 = lVar19 + 0x12;
        } while (lVar22 < pDVar15[uVar9].elementCount);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
      std::ostream::put('(');
      std::ostream::flush();
      uVar9 = local_210 + 1;
      uVar21 = ((long)(this->states).
                      super__Vector_base<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->states).
                      super__Vector_base<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
    } while (uVar9 <= uVar21 && uVar21 - uVar9 != 0);
  }
  create_action_table(this);
  local_2a0 = &local_290;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"");
  pEVar16 = (this->elements).
            super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->elements).
      super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>._M_impl.
      super__Vector_impl_data._M_finish != pEVar16) {
    lVar19 = 8;
    uVar9 = 0;
    do {
      sprintf(local_188,"%+7s",*(undefined8 *)((long)&(pEVar16->super_Elem).key + lVar19));
      local_2c0 = local_2b0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2c0,local_2a0,(long)local_2a0 + local_298);
      std::__cxx11::string::append((char *)&local_2c0);
      std::__cxx11::string::operator=((string *)&local_2a0,(string *)&local_2c0);
      if (local_2c0 != local_2b0) {
        operator_delete(local_2c0);
      }
      uVar9 = uVar9 + 1;
      pEVar16 = (this->elements).
                super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar21 = ((long)(this->elements).
                      super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar16 >> 3) *
               -0x71c71c71c71c71c7;
      lVar19 = lVar19 + 0x48;
    } while (uVar9 <= uVar21 && uVar21 - uVar9 != 0);
  }
  local_2c0 = local_2b0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2c0,local_2a0,(long)local_2a0 + local_298);
  std::__cxx11::string::append((char *)&local_2c0);
  std::__cxx11::string::operator=((string *)&local_2a0,(string *)&local_2c0);
  if (local_2c0 != local_2b0) {
    operator_delete(local_2c0);
  }
  if ((this->action_table).
      super__Vector_base<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>,_std::allocator<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->action_table).
      super__Vector_base<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>,_std::allocator<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar9 = 0;
    do {
      pvVar17 = (local_220->
                super__Vector_base<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>,_std::allocator<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&pvVar17[uVar9].
                   super__Vector_base<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>.
                   _M_impl.super__Vector_impl_data + 8) !=
          pvVar17[uVar9].super__Vector_base<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        pvVar17 = pvVar17 + uVar9;
        lVar19 = 0;
        uVar21 = 0;
        do {
          local_2c0 = local_2b0;
          local_2b8 = 0;
          local_2b0[0] = 0;
          uVar23 = (ulong)*(uint *)(*(long *)&(pvVar17->
                                              super__Vector_base<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>
                                              )._M_impl.super__Vector_impl_data + lVar19);
          if (uVar23 < 4) {
            std::__cxx11::string::_M_replace
                      ((ulong)&local_2c0,0,(char *)0x0,
                       (ulong)(&DAT_001112a8 + *(int *)(&DAT_001112a8 + uVar23 * 4)));
          }
          sprintf(local_188,"%+7s",local_2c0);
          local_148[0] = local_138;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_148,local_2a0,(long)local_2a0 + local_298);
          std::__cxx11::string::append((char *)local_148);
          std::__cxx11::string::operator=((string *)&local_2a0,(string *)local_148);
          if (local_148[0] != local_138) {
            operator_delete(local_148[0]);
          }
          if (local_2c0 != local_2b0) {
            operator_delete(local_2c0);
          }
          uVar21 = uVar21 + 1;
          pvVar17 = (local_220->
                    super__Vector_base<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>,_std::allocator<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + uVar9;
          uVar23 = ((long)*(pointer *)
                           ((long)&(pvVar17->
                                   super__Vector_base<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>
                                   )._M_impl.super__Vector_impl_data + 8) -
                    *(long *)&(pvVar17->
                              super__Vector_base<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>
                              )._M_impl.super__Vector_impl_data >> 2) * -0x5555555555555555;
          lVar19 = lVar19 + 0xc;
        } while (uVar21 <= uVar23 && uVar23 - uVar21 != 0);
      }
      local_2c0 = local_2b0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2c0,local_2a0,(long)local_2a0 + local_298);
      std::__cxx11::string::append((char *)&local_2c0);
      std::__cxx11::string::operator=((string *)&local_2a0,(string *)&local_2c0);
      if (local_2c0 != local_2b0) {
        operator_delete(local_2c0);
      }
      uVar9 = uVar9 + 1;
      uVar21 = ((long)(this->action_table).
                      super__Vector_base<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>,_std::allocator<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->action_table).
                      super__Vector_base<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>,_std::allocator<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    } while (uVar9 <= uVar21 && uVar21 - uVar9 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(char *)local_2a0,local_298);
  if (local_2a0 != &local_290) {
    operator_delete(local_2a0);
  }
  if (local_248 != local_238) {
    operator_delete(local_248);
  }
  if (local_1c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
    operator_delete((void *)local_278._0_8_);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_208);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector(&local_1e8);
  return;
}

Assistant:

GrammarLR::GrammarLR(string* generate, int length){

    //1.解析所有字符串
    vector<vector<string>> vectorGenrates;//这个是用来存放各个表达式

    //解析各个表达式,第一个是非终结符号，后面的是产生式
    for (int i = 0; i < length; i++){
        vector<string> temp;
        parse_productions(generate[i], temp);
        vectorGenrates.push_back(temp);
    }



    //2.添加非终结符添加到find表中,开始的非终结符就是length个
    for (int i = 0; i < length; i++){
        add_elem(vectorGenrates[i][0], false);
    }

    //3.一个个解析产生式,会添加到find表中
    vector<string> result_of_name;
    for (int i = 0; i < length; i++){

        //ElemLeft N_F_E = elements[find_name(vectorGenrates[i][0])];//非终结符，接下来要对这个终结符进行exp的添加

        //对genrates[i]进行分析；
        for (int j = 1; j < vectorGenrates[i].size(); j++){
            parse_elem(vectorGenrates[i][j], result_of_name);
            vector<int> exp;
            for (int m = 0; m < result_of_name.size(); m++){
                int index = find_name(result_of_name[m]);
                if (index == -2){
                    index = add_elem(result_of_name[m], true);
                }
                exp.push_back(index);

            }
            elements[find_name(vectorGenrates[i][0])].add_expression(ExpressLR(exp));
        }
    }

    add_elem("#", true);
    //添加拓广文法
    string name = elements[0].name + "'";
    int index = this->add_elem(name, false);
    vector<int> exp;
    exp.push_back(0);
    elements[index].add_expression(exp);

    //查看输入是不正确
    //测试一下：
    string finnalyC = "finnaly:";
    for (int i = 0; i < elements.size(); i++){
        if (!elements[i].is_finally){
            cout << elements[i].name << "->";
            for (int j = 0; j < elements[i].expression_of_set.size(); j++){
                for (int m = 0; m < elements[i].expression_of_set[j].expression.size(); m++){
                    if (elements[i].expression_of_set[j].expression[m] != -1){
                        cout << elements[elements[i].expression_of_set[j].expression[m]].name;
                    }
                    else
                    {
                        cout << "@";
                    }
                }
                cout << " | ";
            }
            cout << endl;
        }
        else
        {
            finnalyC = finnalyC + " " + elements[i].name;
        }
    }
    cout << finnalyC << endl;

    //6.两表生成（在5的时候就不会再添加新的符号了）
    //同时在这里初始化一下First和Follw表
    get_tow_char_index();

    //7.求first集合
    this->create_first_set();

    //检查一下，first集合
    for (int i = 0; i < elements.size(); i++){
        cout << "first[" << elements[i].name << "]={";
        for (int j = 0; j < first[i].size(); j++){
            if (first[i][j] == -1) cout << "@ ";
            else
            {
                cout << elements[first[i][j]].name << " ";
            }
        }
        cout << "}\n";
    }

    //8.求follow集合
    //将#送到开始符号
    this->follow[0].push_back(find_name("#"));
    this->create_follow_set();


    for (int i = 0; i < elements.size(); i++){

        if (elements[i].is_finally) continue;

        cout << "follow[" << elements[i].name << "]={";
        for (int j = 0; j < follow[i].size(); j++){
            if (follow[i][j] == -1) cout << "@ ";
            else
            {
                cout << elements[follow[i][j]].name << " ";
            }
        }
        cout << "}\n";
    }


    //生成DFA状态表
    this->create_dfa_states();

    //检测DFA
    for (int i = 0; i < this->states.size(); i++){

        for (int j = 0; j < states[i].projects.size(); j++){

            Project tmp = states[i].projects[j];
            cout << elements[tmp.elemKey].name << "->";
            for (int m = 0; m < elements[tmp.elemKey].expression_of_set[tmp.expressIndex].expression.size(); m++){

                if (elements[tmp.elemKey].expression_of_set[tmp.expressIndex][m] != -1){
                    cout << elements[elements[tmp.elemKey].expression_of_set[tmp.expressIndex][m]].name;
                }
                else
                {
                    cout << "@";
                }


            }
            cout << "  ProjectPoint:"<<tmp.projectPoint<<endl;

        }
        for (int j = 0; j < states[i].elementCount; j++){

            if (states[i].next[j] != -1){

                cout << elements[j].name << "--" << states[i].next[j] << "  ";
            }

        }
        cout << endl;

    }

    //创建指导动作的表
    this->create_action_table();

    //将表打印出来
    char formatS[] = "%+7s";//栈的格式
    string text="";
    char buffer[8];
    for (int i = 0; i < elements.size(); i++){
        sprintf(buffer, formatS, elements[i].name.c_str());
        text = text + buffer;
    }
    text = text + "\n";
    for (int i = 0; i < action_table.size(); i++){

        for (int j = 0; j < action_table[i].size(); j++){
            string t;
            switch (action_table[i][j].type)
            {
                case ERROR:
                    t = " ";
                    break;
                case REDUCE:
                    t = "REDUCE";
                    break;
                case SMOVE:
                    t = "SMOVE";
                    break;
                case ACC:
                    t = "ACC";
                    break;
                default:
                    break;
            }
            sprintf(buffer, formatS,t.c_str());
            text = text + buffer;
        }
        text = text + "\n";
    }
    cout << text;
}